

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_basic_types.cpp
# Opt level: O0

bool __thiscall Potassco::BufferedStream::match(BufferedStream *this,char *w)

{
  int iVar1;
  BufferedStream *this_00;
  BufferedStream *__n;
  long lVar2;
  char *in_RSI;
  long in_RDI;
  size_t bLen;
  size_t wLen;
  undefined1 upPos;
  bool local_1;
  
  this_00 = (BufferedStream *)strlen(in_RSI);
  __n = (BufferedStream *)(0x1000 - *(long *)(in_RDI + 0x10));
  if (__n < this_00) {
    if ((BufferedStream *)0x1000 < this_00) {
      Potassco::fail(-1,"bool Potassco::BufferedStream::match(const char *)",0x66,"wLen <= BUF_SIZE"
                     ,"Token too long - Increase BUF_SIZE!",0);
    }
    memcpy(*(void **)(in_RDI + 8),(void *)(*(long *)(in_RDI + 8) + *(long *)(in_RDI + 0x10)),
           (size_t)__n);
    *(BufferedStream **)(in_RDI + 0x10) = __n;
    underflow(this_00,SUB81((ulong)__n >> 0x38,0));
    *(undefined8 *)(in_RDI + 0x10) = 0;
  }
  upPos = (undefined1)((ulong)__n >> 0x38);
  iVar1 = strncmp(in_RSI,(char *)(*(long *)(in_RDI + 8) + *(long *)(in_RDI + 0x10)),(size_t)this_00)
  ;
  if (iVar1 == 0) {
    lVar2 = (long)&this_00->str_ + *(long *)(in_RDI + 0x10);
    *(long *)(in_RDI + 0x10) = lVar2;
    if (*(char *)(*(long *)(in_RDI + 8) + lVar2) == '\0') {
      underflow(this_00,(bool)upPos);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool BufferedStream::match(const char* w) {
	std::size_t wLen = std::strlen(w);
	std::size_t bLen = BUF_SIZE - rpos_;
	if (bLen < wLen) {
		POTASSCO_ASSERT(wLen <= BUF_SIZE, "Token too long - Increase BUF_SIZE!");
		std::memcpy(buf_, buf_ + rpos_, bLen);
		rpos_ = bLen;
		underflow(false);
		rpos_ = 0;
	}
	if (std::strncmp(w, buf_ + rpos_, wLen) == 0) {
		if (!buf_[rpos_ += wLen]) { underflow(); }
		return true;
	}
	return false;
}